

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtmidiout.cpp
# Opt level: O0

int anon_unknown.dwarf_16d52::RtMidiOut_ctor(lua_State *L)

{
  RtMidi *this;
  RtMidiError *midierror;
  RtMidiError *err;
  allocator<char> local_41;
  string local_40;
  RtMidi *local_20;
  RtMidiOut *midiout;
  lua_State *L_local;
  
  midiout = (RtMidiOut *)L;
  this = (RtMidi *)lua_newuserdata(L,0x10);
  local_20 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"RtMidi Output Client",&local_41);
  RtMidiOut::RtMidiOut((RtMidiOut *)this,UNSPECIFIED,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  RtMidi_init(local_20,(lua_State *)midiout,-1);
  lua_getfield(midiout,0xffffd8f0,"luartmidi.rtmidiout");
  lua_setmetatable(midiout,0xfffffffe);
  return 1;
}

Assistant:

int RtMidiOut_ctor(lua_State *L) {
	auto midiout = reinterpret_cast<RtMidiOut *>(
	 lua_newuserdata(L, sizeof(RtMidiOut)));
	try {
		new (midiout) RtMidiOut { };
		RtMidi_init(*midiout, L, -1);
		luaL_getmetatable(L, MT_RTMIDIOUT);
		lua_setmetatable(L, -2);
		return 1;
	}
	catch (RtMidiError &err) {
		auto midierror = reinterpret_cast<RtMidiError *>(
		 lua_newuserdata(L, sizeof(RtMidiError)));
		new (midierror) RtMidiError {err};
		luaL_getmetatable(L, MT_RTMIDIERROR);
		lua_setmetatable(L, -2);
		return lua_error(L);
	}
}